

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

FieldMap * __thiscall FIX::FieldMap::operator=(FieldMap *this,FieldMap *rhs)

{
  _Base_ptr p_Var1;
  vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *this_00;
  FieldMap *this_01;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  FieldMap *local_38;
  
  clear(this);
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::operator=
            (&this->m_fields,&rhs->m_fields);
  message_order::operator=(&this->m_order,&rhs->m_order);
  for (p_Var2 = (rhs->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(rhs->m_groups)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_left;
    for (p_Var3 = p_Var2[1]._M_parent; p_Var3 != p_Var1; p_Var3 = (_Base_ptr)&p_Var3->_M_parent) {
      this_00 = (vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *)
                std::
                map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
                ::operator[](&this->m_groups,(key_type *)(p_Var2 + 1));
      this_01 = (FieldMap *)operator_new(0x70);
      FieldMap(this_01,*(FieldMap **)p_Var3);
      local_38 = this_01;
      std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>::emplace_back<FIX::FieldMap*>
                (this_00,&local_38);
    }
  }
  return this;
}

Assistant:

FieldMap &FieldMap::operator=(const FieldMap &rhs) {
  clear();

  m_fields = rhs.m_fields;
  m_order = rhs.m_order;

  for (auto const &tagWithGroups : rhs.m_groups) {
    for (auto const &group : tagWithGroups.second) {
      m_groups[tagWithGroups.first].push_back(new FieldMap(*group));
    }
  }

  return *this;
}